

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O2

Float __thiscall pbrt::Disk::PDF(Disk *this,ShapeSampleContext *ctx,Vector3f wi)

{
  ShapeIntersection *pSVar1;
  Point3<float> *p2;
  Float FVar2;
  type tVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  undefined1 extraout_var [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  Point3f PVar10;
  Ray ray;
  optional<pbrt::ShapeIntersection> isect;
  undefined8 local_190;
  float local_188;
  Vector3f local_180;
  Tuple3<pbrt::Point3,_float> local_170;
  Tuple3<pbrt::Vector3,_float> local_160;
  Ray local_150;
  optional<pbrt::ShapeIntersection> local_128;
  undefined1 auVar9 [56];
  
  local_180.super_Tuple3<pbrt::Vector3,_float>.z = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar6._8_56_ = wi._8_56_;
  auVar6._0_8_ = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_180.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar6._0_16_);
  ShapeSampleContext::SpawnRay(&local_150,ctx,&local_180);
  Intersect(&local_128,this,&local_150,INFINITY);
  FVar2 = 0.0;
  if (local_128.set == true) {
    FVar2 = Area(this);
    pSVar1 = pstd::optional<pbrt::ShapeIntersection>::value(&local_128);
    auVar5._0_8_ = local_180.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
    auVar5._8_4_ = 0x80000000;
    auVar5._12_4_ = 0x80000000;
    local_160.z = -local_180.super_Tuple3<pbrt::Vector3,_float>.z;
    local_160._0_8_ = vmovlps_avx(auVar5);
    tVar3 = AbsDot<float>(&(pSVar1->intr).super_Interaction.n,(Vector3<float> *)&local_160);
    auVar9 = extraout_var;
    PVar10 = ShapeSampleContext::p(ctx);
    local_188 = PVar10.super_Tuple3<pbrt::Point3,_float>.z;
    auVar7._0_8_ = PVar10.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar7._8_56_ = auVar9;
    local_190 = vmovlps_avx(auVar7._0_16_);
    pSVar1 = pstd::optional<pbrt::ShapeIntersection>::value(&local_128);
    PVar10 = Interaction::p((Interaction *)pSVar1);
    local_170.z = PVar10.super_Tuple3<pbrt::Point3,_float>.z;
    auVar8._0_8_ = PVar10.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar8._8_56_ = auVar9;
    local_170._0_8_ = vmovlps_avx(auVar8._0_16_);
    fVar4 = DistanceSquared<float>((pbrt *)&local_190,(Point3<float> *)&local_170,p2);
    fVar4 = (1.0 / FVar2) / (tVar3 / fVar4);
    FVar2 = (Float)((uint)(ABS(fVar4) != INFINITY) * (int)fVar4);
  }
  pstd::optional<pbrt::ShapeIntersection>::~optional(&local_128);
  return FVar2;
}

Assistant:

PBRT_CPU_GPU
    Float PDF(const ShapeSampleContext &ctx, Vector3f wi) const {
        // Intersect sample ray with shape geometry
        Ray ray = ctx.SpawnRay(wi);
        pstd::optional<ShapeIntersection> isect = Intersect(ray);
        if (!isect)
            return 0;

        // Compute PDF in solid angle measure from shape intersection point
        Float pdf = (1 / Area()) / (AbsDot(isect->intr.n, -wi) /
                                    DistanceSquared(ctx.p(), isect->intr.p()));
        if (IsInf(pdf))
            pdf = 0;

        return pdf;
    }